

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::ProcessIntersectList(Clipper *this)

{
  value_type pIVar1;
  IntersectNode *pIVar2;
  reference ppIVar3;
  IntersectNode *iNode;
  size_t i;
  Clipper *this_local;
  
  iNode = (IntersectNode *)0x0;
  while( true ) {
    pIVar2 = (IntersectNode *)
             std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
             ::size(&this->m_IntersectList);
    if (pIVar2 <= iNode) break;
    ppIVar3 = std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
              ::operator[](&this->m_IntersectList,(size_type)iNode);
    pIVar1 = *ppIVar3;
    IntersectEdges(this,pIVar1->Edge1,pIVar1->Edge2,&pIVar1->Pt);
    ClipperBase::SwapPositionsInAEL
              ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
               pIVar1->Edge1,pIVar1->Edge2);
    if (pIVar1 != (value_type)0x0) {
      operator_delete(pIVar1,0x20);
    }
    iNode = (IntersectNode *)((long)&iNode->Edge1 + 1);
  }
  std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>::clear
            (&this->m_IntersectList);
  return;
}

Assistant:

void Clipper::ProcessIntersectList()
{
  for (size_t i = 0; i < m_IntersectList.size(); ++i)
  {
    IntersectNode* iNode = m_IntersectList[i];
    {
      IntersectEdges( iNode->Edge1, iNode->Edge2, iNode->Pt);
      SwapPositionsInAEL( iNode->Edge1 , iNode->Edge2 );
    }
    delete iNode;
  }
  m_IntersectList.clear();
}